

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

string * __thiscall
units::generateRawUnitString_abi_cxx11_
          (string *__return_storage_ptr__,units *this,precise_unit *un,uint64_t flags)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int power;
  int power_00;
  int power_01;
  int power_02;
  int power_03;
  int power_04;
  int power_05;
  int power_06;
  int power_07;
  int power_08;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar10 = *(int *)(this + 8);
  power = (iVar10 << 0x1c) >> 0x1c;
  iVar1 = addPosUnits(__return_storage_ptr__,"m",power,flags);
  power_00 = (iVar10 << 0x15) >> 0x1d;
  iVar2 = addPosUnits(__return_storage_ptr__,"kg",power_00,flags);
  power_01 = (int)(char)iVar10 >> 4;
  iVar3 = addPosUnits(__return_storage_ptr__,"s",power_01,flags);
  power_02 = (iVar10 << 0x12) >> 0x1d;
  iVar4 = addPosUnits(__return_storage_ptr__,"A",power_02,flags);
  power_03 = (iVar10 << 0xd) >> 0x1d;
  iVar5 = addPosUnits(__return_storage_ptr__,"K",power_03,flags);
  power_04 = (iVar10 << 0xb) >> 0x1e;
  iVar6 = addPosUnits(__return_storage_ptr__,"mol",power_04,flags);
  power_05 = (int)(short)iVar10 >> 0xe;
  iVar7 = addPosUnits(__return_storage_ptr__,"cd",power_05,flags);
  power_06 = (iVar10 << 4) >> 0x1e;
  iVar8 = addPosUnits(__return_storage_ptr__,"item",power_06,flags);
  power_07 = (iVar10 << 6) >> 0x1e;
  iVar9 = addPosUnits(__return_storage_ptr__,"$",power_07,flags);
  power_08 = (iVar10 << 8) >> 0x1d;
  iVar10 = addPosUnits(__return_storage_ptr__,"rad",power_08,flags);
  addUnitFlagStrings((precise_unit *)this,__return_storage_ptr__);
  iVar10 = iVar8 + iVar9 + iVar5 + iVar6 + iVar7 + iVar3 + iVar4 + iVar2 + iVar1 + iVar10;
  if (iVar10 != 0) {
    if (iVar10 == 1) {
      if ((power_01 == -1) && (__return_storage_ptr__->_M_string_length == 0)) {
        addUnitPower(__return_storage_ptr__,"Hz",1,flags);
      }
      else {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,'/');
        addPosUnits(__return_storage_ptr__,"m",-power,flags);
        addPosUnits(__return_storage_ptr__,"kg",-power_00,flags);
        addPosUnits(__return_storage_ptr__,"s",-power_01,flags);
        addPosUnits(__return_storage_ptr__,"A",-power_02,flags);
        addPosUnits(__return_storage_ptr__,"K",-power_03,flags);
        addPosUnits(__return_storage_ptr__,"mol",-power_04,flags);
        addPosUnits(__return_storage_ptr__,"cd",-power_05,flags);
        addPosUnits(__return_storage_ptr__,"item",-power_06,flags);
        addPosUnits(__return_storage_ptr__,"$",-power_07,flags);
        addPosUnits(__return_storage_ptr__,"rad",-power_08,flags);
      }
    }
    else {
      addNegUnits(__return_storage_ptr__,"m",power,flags);
      addNegUnits(__return_storage_ptr__,"kg",power_00,flags);
      addNegUnits(__return_storage_ptr__,"s",power_01,flags);
      addNegUnits(__return_storage_ptr__,"A",power_02,flags);
      addNegUnits(__return_storage_ptr__,"K",power_03,flags);
      addNegUnits(__return_storage_ptr__,"mol",power_04,flags);
      addNegUnits(__return_storage_ptr__,"cd",power_05,flags);
      addNegUnits(__return_storage_ptr__,"item",power_06,flags);
      addNegUnits(__return_storage_ptr__,"$",power_07,flags);
      addNegUnits(__return_storage_ptr__,"rad",power_08,flags);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string
    generateRawUnitString(const precise_unit& un, std::uint64_t flags)
{
    std::string val;
    auto bu = un.base_units();
    int cnt{0};
    cnt += addPosUnits(val, "m", bu.meter(), flags);
    cnt += addPosUnits(val, "kg", bu.kg(), flags);
    cnt += addPosUnits(val, "s", bu.second(), flags);
    cnt += addPosUnits(val, "A", bu.ampere(), flags);
    cnt += addPosUnits(val, "K", bu.kelvin(), flags);
    cnt += addPosUnits(val, "mol", bu.mole(), flags);
    cnt += addPosUnits(val, "cd", bu.candela(), flags);
    cnt += addPosUnits(val, "item", bu.count(), flags);
    cnt += addPosUnits(val, "$", bu.currency(), flags);
    cnt += addPosUnits(val, "rad", bu.radian(), flags);
    addUnitFlagStrings(un, val);
    if (cnt == 1) {
        if (bu.second() == -1 && val.empty()) {
            // deal with 1/s  which is usually Hz
            addPosUnits(val, "Hz", 1, flags);
            return val;
        }
        val.push_back('/');
        addPosUnits(val, "m", -bu.meter(), flags);
        addPosUnits(val, "kg", -bu.kg(), flags);
        addPosUnits(val, "s", -bu.second(), flags);
        addPosUnits(val, "A", -bu.ampere(), flags);
        addPosUnits(val, "K", -bu.kelvin(), flags);
        addPosUnits(val, "mol", -bu.mole(), flags);
        addPosUnits(val, "cd", -bu.candela(), flags);
        addPosUnits(val, "item", -bu.count(), flags);
        addPosUnits(val, "$", -bu.currency(), flags);
        addPosUnits(val, "rad", -bu.radian(), flags);
    } else if (cnt > 1) {
        addNegUnits(val, "m", bu.meter(), flags);
        addNegUnits(val, "kg", bu.kg(), flags);
        addNegUnits(val, "s", bu.second(), flags);
        addNegUnits(val, "A", bu.ampere(), flags);
        addNegUnits(val, "K", bu.kelvin(), flags);
        addNegUnits(val, "mol", bu.mole(), flags);
        addNegUnits(val, "cd", bu.candela(), flags);
        addNegUnits(val, "item", bu.count(), flags);
        addNegUnits(val, "$", bu.currency(), flags);
        addNegUnits(val, "rad", bu.radian(), flags);
    }
    return val;
}